

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawLineEx(Vector2 startPos,Vector2 endPos,float thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector2 local_28;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  fVar1 = endPos.x;
  fStack_c = endPos.y;
  fStack_20 = startPos.x;
  fStack_1c = startPos.y;
  if (0.0 < thick) {
    fVar2 = fVar1 - fStack_20;
    fStack_10 = fStack_c - fStack_1c;
    fVar3 = SQRT(fVar2 * fVar2 + fStack_10 * fStack_10);
    if (0.0 < fVar3) {
      fVar3 = thick / (fVar3 + fVar3);
      local_18 = fStack_10 * -fVar3;
      fStack_10 = fStack_10 * -fVar3;
      local_28.x = fStack_20 - local_18;
      local_28.y = fStack_1c - fVar2 * fVar3;
      fStack_20 = fStack_20 + fStack_10;
      fStack_1c = fStack_1c + fVar2 * fVar3;
      local_18 = fVar1 - local_18;
      fStack_14 = fStack_c - fVar2 * fVar3;
      fStack_10 = fStack_10 + fVar1;
      fStack_c = fVar2 * fVar3 + fStack_c;
      DrawTriangleStrip(&local_28,4,color);
    }
  }
  return;
}

Assistant:

void DrawLineEx(Vector2 startPos, Vector2 endPos, float thick, Color color)
{
    Vector2 delta = { endPos.x - startPos.x, endPos.y - startPos.y };
    float length = sqrtf(delta.x*delta.x + delta.y*delta.y);

    if ((length > 0) && (thick > 0))
    {
        float scale = thick/(2*length);

        Vector2 radius = { -scale*delta.y, scale*delta.x };
        Vector2 strip[4] = {
            { startPos.x - radius.x, startPos.y - radius.y },
            { startPos.x + radius.x, startPos.y + radius.y },
            { endPos.x - radius.x, endPos.y - radius.y },
            { endPos.x + radius.x, endPos.y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);
    }
}